

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O1

void blake2b_final(blake2b_state *S,void *out,size_t outlen)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  uint64_t uStack_30;
  
  uVar3 = S->buflen;
  puVar1 = S->t;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 + uVar3;
  S->t[1] = S->t[1] + (ulong)CARRY8(uVar2,uVar3);
  memset(S->buf + uVar3,0,0x80 - uVar3);
  blake2b_compress(S,S->buf,0xffffffffffffffff);
  local_68 = S->h[0];
  uStack_60 = S->h[1];
  local_58 = S->h[2];
  uStack_50 = S->h[3];
  local_48 = S->h[4];
  uStack_40 = S->h[5];
  local_38 = S->h[6];
  uStack_30 = S->h[7];
  memcpy(out,&local_68,outlen);
  clear_internal_memory(&local_68,0x40);
  clear_internal_memory(S->buf,0x80);
  clear_internal_memory(S,0x40);
  return;
}

Assistant:

void blake2b_final(blake2b_state *S, void *out, size_t outlen)
{
    uint8_t buffer[BLAKE2B_OUTBYTES] = {0};
    unsigned int i;

    blake2b_increment_counter(S, S->buflen);
    memset(&S->buf[S->buflen], 0, BLAKE2B_BLOCKBYTES - S->buflen); /* Padding */
    blake2b_compress(S, S->buf, UINT64_C(0xFFFFFFFFFFFFFFFF));

    for (i = 0; i < 8; ++i) { /* Output full hash to temp buffer */
        store64(buffer + i * sizeof(uint64_t), S->h[i]);
    }

    memcpy(out, buffer, outlen);
    clear_internal_memory(buffer, sizeof(buffer));
    clear_internal_memory(S->buf, sizeof(S->buf));
    clear_internal_memory(S->h, sizeof(S->h));
}